

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd2D.c
# Opt level: O2

void add_source_fdtd_2D(source_type sType,fdtd2D *fdtd,fdtd_source src,float_type positionX,
                       float_type positionY)

{
  ulong *puVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  void *pvVar5;
  uint uVar6;
  char *__ptr;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar11 [64];
  undefined8 in_XMM1_Qb;
  ulong uStack_30;
  
  auVar11._8_56_ = in_register_00001208;
  auVar11._0_8_ = positionX;
  auVar3._8_8_ = in_XMM1_Qb;
  auVar3._0_8_ = positionY;
  auVar3 = vunpcklpd_avx(auVar11._0_16_,auVar3);
  auVar10._0_8_ = fdtd->dx;
  auVar10._8_8_ = fdtd->dy;
  auVar10 = vdivpd_avx(auVar3,auVar10);
  auVar10 = vroundpd_avx(auVar10,9);
  auVar10 = vcvttpd2uqq_avx512vl(auVar10);
  if (auVar10._0_8_ < fdtd->sizeX) {
    uVar4 = vpextrq_avx(auVar10,1);
    if (uVar4 < fdtd->sizeY) {
      if (sType == source_electric) {
        lVar8 = 0xe8;
        lVar7 = 0xf0;
        lVar9 = 0xe0;
      }
      else {
        if (sType != source_magnetic) {
          return;
        }
        lVar8 = 0x100;
        lVar7 = 0x108;
        lVar9 = 0xf8;
      }
      uVar6 = *(int *)((long)fdtd->psi_hx_y + lVar9 + -0x40) + 1;
      *(uint *)((long)fdtd->psi_hx_y + lVar9 + -0x40) = uVar6;
      pvVar5 = realloc(*(void **)((long)fdtd->psi_hx_y + lVar7 + -0x40),(ulong)uVar6 << 4);
      *(void **)((long)fdtd->psi_hx_y + lVar7 + -0x40) = pvVar5;
      uStack_30 = auVar10._8_8_;
      uVar6 = *(uint *)((long)fdtd->psi_hx_y + lVar9 + -0x40);
      puVar1 = (ulong *)((long)pvVar5 + (ulong)(uVar6 - 1) * 0x10);
      *puVar1 = auVar10._0_8_;
      puVar1[1] = uStack_30;
      pvVar5 = realloc(*(void **)((long)fdtd->psi_hx_y + lVar8 + -0x40),(ulong)uVar6 << 5);
      *(void **)((long)fdtd->psi_hx_y + lVar8 + -0x40) = pvVar5;
      puVar2 = (undefined8 *)
               ((long)pvVar5 + (ulong)(*(int *)((long)fdtd->psi_hx_y + lVar9 + -0x40) - 1) * 0x20);
      *puVar2 = src._0_8_;
      puVar2[1] = src.field_1.field_0.gaussian_pulse_delay;
      puVar2[2] = src.field_1.field_0.gaussian_pulse_peak_time;
      puVar2[3] = src.field_1.field_0.gaussian_peak_val;
      return;
    }
    __ptr = "add_source_fdtd_2D: adding source outside of the Y dimension boundaries\n";
  }
  else {
    __ptr = "add_source_fdtd_2D: adding source outside of the X dimension boundaries\n";
  }
  fwrite(__ptr,0x48,1,_stderr);
  exit(1);
}

Assistant:

void add_source_fdtd_2D(enum source_type sType, struct fdtd2D *fdtd,
                        struct fdtd_source src, float_type positionX,
                        float_type positionY) {
  float_type posXf = floor(positionX / fdtd->dx);
  float_type posYf = floor(positionY / fdtd->dy);
  uintmax_t posX = (uintmax_t)posXf;
  uintmax_t posY = (uintmax_t)posYf;
  if (posX >= fdtd->sizeX) {
    fprintf(stderr, "add_source_fdtd_2D: adding source outside of the X "
                    "dimension boundaries\n");
    exit(EXIT_FAILURE);
  }
  if (posY >= fdtd->sizeY) {
    fprintf(stderr, "add_source_fdtd_2D: adding source outside of the Y "
                    "dimension boundaries\n");
    exit(EXIT_FAILURE);
  }
  switch (sType) {
  case source_electric: {
    fdtd->num_Jsources++;
    fdtd->JsourceLocations = realloc(
        fdtd->JsourceLocations, VLA_2D_size(uintmax_t, fdtd->num_Jsources, 2));
    VLA_2D_definition(uintmax_t, fdtd->num_Jsources, 2, JsourceLocations,
                      fdtd->JsourceLocations);
    JsourceLocations[fdtd->num_Jsources - 1][0] = posX;
    JsourceLocations[fdtd->num_Jsources - 1][1] = posY;
    fdtd->Jsources =
        realloc(fdtd->Jsources, fdtd->num_Jsources * sizeof(*fdtd->Jsources));
    fdtd->Jsources[fdtd->num_Jsources - 1] = src;
    break;
  }
  case source_magnetic:
    fdtd->num_Msources++;
    fdtd->MsourceLocations = realloc(
        fdtd->MsourceLocations, VLA_2D_size(uintmax_t, fdtd->num_Msources, 2));
    VLA_2D_definition(uintmax_t, fdtd->num_Msources, 2, MsourceLocations,
                      fdtd->MsourceLocations);
    MsourceLocations[fdtd->num_Msources - 1][0] = posX;
    MsourceLocations[fdtd->num_Msources - 1][1] = posY;
    fdtd->Msources =
        realloc(fdtd->Msources, fdtd->num_Msources * sizeof(*fdtd->Msources));
    fdtd->Msources[fdtd->num_Msources - 1] = src;
    break;
  }
}